

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_8_3_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  lVar4 = (long)dstride;
  if (block_width == 8) {
    for (lVar5 = 0; lVar5 < block_height; lVar5 = lVar5 + 2) {
      auVar6 = vpackuswb_avx(*(undefined1 (*) [16])in,*(undefined1 (*) [16])((long)in + 0x120));
      *(long *)dest = auVar6._0_8_;
      uVar3 = vpextrq_avx(auVar6,1);
      *(undefined8 *)((long)dest + lVar4) = uVar3;
      in = (uint16_t *)((long)in + 0x240);
      dest = (void *)((long)dest + lVar4 * 2);
    }
  }
  else {
    for (lVar5 = 0; lVar5 < block_height; lVar5 = lVar5 + 4) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)in;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)((long)in + 0x120);
      auVar6 = vpunpcklqdq_avx(auVar7,auVar6);
      auVar6 = vpackuswb_avx(auVar6,auVar6);
      uVar1 = *(ulong *)((long)in + 0x240);
      uVar2 = *(ulong *)((long)in + 0x360);
      *(int *)dest = auVar6._4_4_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar1;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar2;
      auVar7 = vpunpcklqdq_avx(auVar9,auVar8);
      auVar7 = vpackuswb_avx(auVar7,auVar7);
      *(int *)((long)dest + lVar4) = auVar6._0_4_;
      *(int *)((long)dest + lVar4 * 2) = auVar7._4_4_;
      *(int *)((long)dest + lVar4 * 3) = auVar7._0_4_;
      in = (uint16_t *)((long)in + 0x480);
      dest = (void *)((long)dest + lVar4 * 4);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_3)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  (void)pri_strength;
  (void)sec_strength;
  (void)dir;
  (void)pri_damping;
  (void)sec_damping;
  (void)coeff_shift;
  (void)block_width;

  if (block_width == 8) {
    copy_block_8xh(/*is_lowbd=*/1, dest, dstride, in, block_height);
  } else {
    copy_block_4xh(/*is_lowbd=*/1, dest, dstride, in, block_height);
  }
}